

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  string local_af0;
  TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> local_ad0;
  
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_af0);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::TPZQuadSphere(&local_ad0);
  iVar3 = pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::ClassId(&local_ad0);
  local_ad0.super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad.
  super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.super_TPZSavable.
  _vptr_TPZSavable = (TPZSavable)&PTR__TPZQuadSphere_018a70c0;
  local_ad0.fxc._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_ad0.fxc.fStore != (double *)0x0) {
    operator_delete__(local_ad0.fxc.fStore);
  }
  local_ad0.super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad.
  super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.super_TPZSavable.
  _vptr_TPZSavable = (TPZSavable)&PTR__TPZGeoBlend_018a7a40;
  lVar4 = 0x8e0;
  do {
    TPZTransform<double>::~TPZTransform
              ((TPZTransform<double> *)
               ((long)local_ad0.super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad.
                      super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar4 + -8));
    lVar4 = lVar4 + -0x1a0;
  } while (lVar4 != -0xe0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}